

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::RandomShaderCase::checkProgramLimits
          (RandomShaderCase *this,Shader *vtxShader,Shader *frgShader)

{
  pointer ppSVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  long *plVar3;
  const_iterator it;
  pointer ppSVar4;
  size_type *psVar5;
  int iVar6;
  undefined1 auVar7 [16];
  int numSupported;
  int numRequiredCombinedSamplers;
  int local_c8;
  int local_c4;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  ppSVar4 = (vtxShader->m_uniforms).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (vtxShader->m_uniforms).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar6 = 0;
  iVar2 = 0;
  if (ppSVar4 != ppSVar1) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)((((*ppSVar4)->m_variable->m_type).m_baseType & ~TYPE_FLOAT) ==
                            TYPE_SAMPLER_2D);
      ppSVar4 = ppSVar4 + 1;
    } while (ppSVar4 != ppSVar1);
  }
  ppSVar4 = (frgShader->m_uniforms).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (frgShader->m_uniforms).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar4 != ppSVar1) {
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (uint)((((*ppSVar4)->m_variable->m_type).m_baseType & ~TYPE_FLOAT) ==
                            TYPE_SAMPLER_2D);
      ppSVar4 = ppSVar4 + 1;
    } while (ppSVar4 != ppSVar1);
  }
  iVar6 = iVar6 + iVar2;
  if (0 < iVar6) {
    local_c8 = -1;
    local_c4 = iVar6;
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x8b4d,&local_c8);
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    local_60._M_string_length._0_4_ = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
    if ((int)local_60._M_string_length != 0) {
      auVar7 = __cxa_allocate_exception(0x38);
      local_60._M_dataplus._M_p = (pointer)glu::getErrorName;
      de::toString<tcu::Format::Enum<int,2ul>>(&local_c0,(de *)&local_60,auVar7._8_8_);
      std::operator+(&local_a0,"Limit query failed: ",&local_c0);
      tcu::TestError::TestError(auVar7._0_8_,&local_a0);
      __cxa_throw(auVar7._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (local_c8 < iVar6) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>(&local_80,&local_c4);
      std::operator+(&local_60,"Program requires ",&local_80);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_c0._M_dataplus._M_p = (pointer)*plVar3;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_c0._M_dataplus._M_p == psVar5) {
        local_c0.field_2._M_allocated_capacity = *psVar5;
        local_c0.field_2._8_8_ = plVar3[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar5;
      }
      local_c0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      de::toString<int>(&local_40,&local_c8);
      std::operator+(&local_a0,&local_c0,&local_40);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_a0);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void RandomShaderCase::checkProgramLimits (const rsg::Shader& vtxShader, const rsg::Shader& frgShader) const
{
	const int numRequiredCombinedSamplers = getNumSamplerUniforms(vtxShader.getUniforms()) + getNumSamplerUniforms(frgShader.getUniforms());

	if (numRequiredCombinedSamplers > 0)
	{
		int				numSupported	= -1;
		GLenum			error;

		m_renderCtx.getFunctions().getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &numSupported);
		error = m_renderCtx.getFunctions().getError();

		if (error != GL_NO_ERROR)
			throw tcu::TestError("Limit query failed: " + de::toString(glu::getErrorStr(error)));

		if (numSupported < numRequiredCombinedSamplers)
			throw tcu::NotSupportedError("Program requires " + de::toString(numRequiredCombinedSamplers) + " sampler(s). Implementation supports " + de::toString(numSupported));
	}
}